

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O1

array_type * __thiscall
toml::basic_value<toml::type_config>::as_array(basic_value<toml::type_config> *this)

{
  string local_38;
  
  if (this->type_ == array) {
    return (array_type *)(this->field_1).integer_.value;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"toml::value::as_array()","");
  throw_bad_cast(this,&local_38,array);
}

Assistant:

array_type const& as_array() const
    {
        if(this->type_ != value_t::array)
        {
            this->throw_bad_cast("toml::value::as_array()", value_t::array);
        }
        return this->array_.value.get();
    }